

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O1

void ntru_ring_multiply(uint16_t *out,uint16_t *a,uint16_t *b,uint p,uint q)

{
  int *piVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  long lVar5;
  void *__s;
  uint uVar6;
  ulong uVar7;
  short sVar8;
  short sVar9;
  ulong uVar10;
  ulong uVar11;
  short sVar12;
  uint uVar13;
  int iVar14;
  ulong factor1;
  
  sVar12 = (short)q;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (ulong)q & 0xffff;
  lVar5 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000000000000)) / auVar3,0);
  uVar6 = p * 2;
  factor1 = (ulong)uVar6;
  __s = safemalloc(factor1,4,0);
  if (uVar6 != 0) {
    memset(__s,0,factor1 * 4);
  }
  uVar4 = (ulong)p;
  if (p != 0) {
    uVar7 = 0;
    do {
      uVar2 = a[uVar7];
      uVar10 = 0;
      do {
        uVar11 = (ulong)(uint)((int)uVar7 + (int)uVar10);
        uVar13 = (uint)b[uVar10] * (uint)uVar2 + *(int *)((long)__s + uVar11 * 4);
        iVar14 = uVar13 - (uint)(ushort)(lVar5 * (ulong)uVar13 >> 0x30) * (int)((ulong)q & 0xffff);
        uVar13 = q;
        if ((short)((short)iVar14 - sVar12) < 0) {
          uVar13 = 0;
        }
        *(uint *)((long)__s + uVar11 * 4) = iVar14 - uVar13 & 0xffff;
        uVar10 = uVar10 + 1;
      } while (uVar4 != uVar10);
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar4);
  }
  uVar6 = uVar6 - 1;
  if (p <= uVar6) {
    uVar7 = (ulong)p;
    do {
      uVar11 = (ulong)uVar6;
      uVar10 = (ulong)((int)uVar7 - 1);
      piVar1 = (int *)((long)__s + uVar10 * 4);
      *piVar1 = *piVar1 + *(int *)((long)__s + uVar11 * 4);
      piVar1 = (int *)((long)__s + uVar7 * 4);
      *piVar1 = *piVar1 + *(int *)((long)__s + uVar11 * 4);
      *(undefined4 *)((long)__s + uVar11 * 4) = 0;
      uVar6 = uVar6 - 1;
      uVar7 = uVar10;
    } while (p <= uVar6);
  }
  if (p != 0) {
    uVar7 = 0;
    do {
      uVar6 = *(uint *)((long)__s + uVar7 * 4);
      sVar8 = (short)uVar6 - (short)((ulong)uVar6 * lVar5 >> 0x30) * sVar12;
      sVar9 = sVar12;
      if ((short)(sVar8 - sVar12) < 0) {
        sVar9 = 0;
      }
      out[uVar7] = sVar8 - sVar9;
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
  }
  smemclr(__s,factor1 * 4);
  safefree(__s);
  return;
}

Assistant:

void ntru_ring_multiply(uint16_t *out, const uint16_t *a, const uint16_t *b,
                        unsigned p, unsigned q)
{
    SETUP;

    /*
     * Strategy: just compute the full product with 2p coefficients,
     * and then reduce it mod x^p-x-1 by working downwards from the
     * top coefficient replacing x^{p+k} with (x+1)x^k for k = ...,1,0.
     *
     * Possibly some speed could be gained here by doing the recursive
     * Karatsuba optimisation for the initial multiplication? But I
     * haven't tried it.
     */
    uint32_t *unreduced = snewn(2*p, uint32_t);
    for (unsigned i = 0; i < 2*p; i++)
        unreduced[i] = 0;
    for (unsigned i = 0; i < p; i++)
        for (unsigned j = 0; j < p; j++)
            unreduced[i+j] = REDUCE(unreduced[i+j] + a[i] * b[j]);

    for (unsigned i = 2*p - 1; i >= p; i--) {
        unreduced[i-p] += unreduced[i];
        unreduced[i-p+1] += unreduced[i];
        unreduced[i] = 0;
    }

    for (unsigned i = 0; i < p; i++)
        out[i] = REDUCE(unreduced[i]);

    smemclr(unreduced, 2*p * sizeof(*unreduced));
    sfree(unreduced);
}